

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhinull.cpp
# Opt level: O1

void __thiscall QRhiNull::simulateTextureGenMips(QRhiNull *this,TextureOp *u)

{
  QRhiTexture *pQVar1;
  QImage *this_00;
  quint64 qVar2;
  QImageData *pQVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long in_FS_OFFSET;
  QSize baseSize;
  QSize local_80;
  QImage local_78;
  QSize local_60;
  undefined1 local_58 [16];
  QImageData *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = u->dst;
  local_60 = pQVar1->m_pixelSize;
  uVar4 = QRhi::mipLevelsForSize(&local_60);
  if (1 < (int)uVar4) {
    uVar5 = 1;
    lVar6 = 0x28;
    do {
      this_00 = (QImage *)pQVar1[1].super_QRhiResource.m_id;
      local_80 = QRhi::sizeForMipLevel((int)uVar5,&local_60);
      QImage::scaled(&local_78,this_00,&local_80,IgnoreAspectRatio,FastTransformation);
      if (lVar6 == 400) {
        simulateTextureGenMips();
        goto LAB_00461d6a;
      }
      qVar2 = pQVar1[1].super_QRhiResource.m_id;
      local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QPaintDevice::QPaintDevice((QPaintDevice *)local_58);
      pQVar3 = local_78.d;
      local_58._0_8_ = &PTR__QImage_007e2f38;
      local_78.d = (QImageData *)0x0;
      local_48 = *(QImageData **)(qVar2 + lVar6);
      *(QImageData **)(qVar2 + lVar6) = pQVar3;
      QImage::~QImage((QImage *)local_58);
      QImage::~QImage(&local_78);
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x18;
    } while (uVar4 != uVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00461d6a:
  __stack_chk_fail();
}

Assistant:

void QRhiNull::simulateTextureGenMips(const QRhiResourceUpdateBatchPrivate::TextureOp &u)
{
    QNullTexture *texD = QRHI_RES(QNullTexture, u.dst);
    const QSize baseSize = texD->pixelSize();
    const int levelCount = q->mipLevelsForSize(baseSize);
    for (int level = 1; level < levelCount; ++level)
        texD->image[0][level] = texD->image[0][0].scaled(q->sizeForMipLevel(level, baseSize));
}